

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightVectorPhrase.hpp
# Opt level: O0

WeightVectorPhrase * __thiscall
wv::WeightVectorPhrase::getConcreteCoord_abi_cxx11_(WeightVectorPhrase *this,uint32_t number)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  uint32_t number_local;
  WeightVectorPhrase *this_local;
  
  pbVar1 = cont::
           StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[]((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(CONCAT44(in_register_00000034,number) + 8),in_EDX);
  std::__cxx11::string::string((string *)this,(string *)pbVar1);
  return this;
}

Assistant:

std::string getConcreteCoord(uint32_t number) const
        {
            return m_Coords[number]; //m_Coords.at(number); 
        }